

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::python::Generator::PrintMessage
          (Generator *this,Descriptor *message_descriptor,string *prefix,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *to_register,bool is_nested)

{
  size_t *this_00;
  Printer *pPVar1;
  bool bVar2;
  string *psVar3;
  mapped_type *pmVar4;
  undefined1 local_268 [8];
  string module_name;
  key_type local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  allocator local_1d9;
  key_type local_1d8;
  string local_1b8;
  allocator local_191;
  key_type local_190;
  undefined1 local_170 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  m;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  undefined1 local_50 [8];
  string qualified_name;
  bool is_nested_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *to_register_local;
  string *prefix_local;
  Descriptor *message_descriptor_local;
  Generator *this_local;
  
  qualified_name.field_2._M_local_buf[0xf] = is_nested;
  std::__cxx11::string::string((string *)local_50);
  if ((qualified_name.field_2._M_local_buf[0xf] & 1U) == 0) {
    psVar3 = Descriptor::name_abi_cxx11_(message_descriptor);
    anon_unknown_0::ResolveKeyword
              ((string *)&m._M_t._M_impl.super__Rb_tree_header._M_node_count,psVar3);
    this_00 = &m._M_t._M_impl.super__Rb_tree_header._M_node_count;
    std::__cxx11::string::operator=((string *)local_50,(string *)this_00);
    std::__cxx11::string::~string((string *)this_00);
    pPVar1 = this->printer_;
    psVar3 = Descriptor::name_abi_cxx11_(message_descriptor);
    io::Printer::Print<char[15],std::__cxx11::string,char[5],std::__cxx11::string>
              (pPVar1,
               "$qualified_name$ = _reflection.GeneratedProtocolMessageType(\'$name$\', (_message.Message,), {\n"
               ,(char (*) [15])"qualified_name",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50,
               (char (*) [5])0x77db8d,psVar3);
  }
  else {
    psVar3 = Descriptor::name_abi_cxx11_(message_descriptor);
    bVar2 = anon_unknown_0::IsPythonKeyword(psVar3);
    if (bVar2) {
      std::operator+(&local_e0,"getattr(",prefix);
      std::operator+(&local_c0,&local_e0,", \'");
      psVar3 = Descriptor::name_abi_cxx11_(message_descriptor);
      std::operator+(&local_a0,&local_c0,psVar3);
      std::operator+(&local_80,&local_a0,"\')");
      std::__cxx11::string::operator=((string *)local_50,(string *)&local_80);
      std::__cxx11::string::~string((string *)&local_80);
      std::__cxx11::string::~string((string *)&local_a0);
      std::__cxx11::string::~string((string *)&local_c0);
      std::__cxx11::string::~string((string *)&local_e0);
    }
    else {
      std::operator+(&local_120,prefix,".");
      psVar3 = Descriptor::name_abi_cxx11_(message_descriptor);
      std::operator+(&local_100,&local_120,psVar3);
      std::__cxx11::string::operator=((string *)local_50,(string *)&local_100);
      std::__cxx11::string::~string((string *)&local_100);
      std::__cxx11::string::~string((string *)&local_120);
    }
    pPVar1 = this->printer_;
    psVar3 = Descriptor::name_abi_cxx11_(message_descriptor);
    io::Printer::Print<char[5],std::__cxx11::string>
              (pPVar1,
               "\'$name$\' : _reflection.GeneratedProtocolMessageType(\'$name$\', (_message.Message,), {\n"
               ,(char (*) [5])0x77db8d,psVar3);
  }
  io::Printer::Indent(this->printer_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(to_register,(value_type *)local_50);
  PrintNestedMessages(this,message_descriptor,(string *)local_50,to_register);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)local_170);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_190,"descriptor_key",&local_191);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_170,&local_190);
  std::__cxx11::string::operator=((string *)pmVar4,"DESCRIPTOR");
  std::__cxx11::string::~string((string *)&local_190);
  std::allocator<char>::~allocator((allocator<char> *)&local_191);
  if ((this->pure_python_workable_ & 1U) == 0) {
    psVar3 = Descriptor::full_name_abi_cxx11_(message_descriptor);
    std::operator+(&local_220,"_descriptor.Descriptor(full_name=\'",psVar3);
    std::operator+(&local_200,&local_220,"\')");
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_240,"descriptor_name",
               (allocator *)(module_name.field_2._M_local_buf + 0xf));
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_170,&local_240);
    std::__cxx11::string::operator=((string *)pmVar4,(string *)&local_200);
    std::__cxx11::string::~string((string *)&local_240);
    std::allocator<char>::~allocator((allocator<char> *)(module_name.field_2._M_local_buf + 0xf));
    std::__cxx11::string::~string((string *)&local_200);
    std::__cxx11::string::~string((string *)&local_220);
  }
  else {
    ModuleLevelDescriptorName<google::protobuf::Descriptor>(&local_1b8,this,message_descriptor);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1d8,"descriptor_name",&local_1d9);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_170,&local_1d8);
    std::__cxx11::string::operator=((string *)pmVar4,(string *)&local_1b8);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1d9);
    std::__cxx11::string::~string((string *)&local_1b8);
  }
  io::Printer::Print(this->printer_,
                     (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)local_170,"\'$descriptor_key$\' : $descriptor_name$,\n");
  psVar3 = FileDescriptor::name_abi_cxx11_(this->file_);
  anon_unknown_0::ModuleName((string *)local_268,psVar3);
  io::Printer::Print<char[12],std::__cxx11::string>
            (this->printer_,"\'__module__\' : \'$module_name$\'\n",(char (*) [12])"module_name",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_268);
  pPVar1 = this->printer_;
  psVar3 = Descriptor::full_name_abi_cxx11_(message_descriptor);
  io::Printer::Print<char[10],std::__cxx11::string>
            (pPVar1,"# @@protoc_insertion_point(class_scope:$full_name$)\n",(char (*) [10])0x7872ae,
             psVar3);
  io::Printer::Print<>(this->printer_,"})\n");
  io::Printer::Outdent(this->printer_);
  std::__cxx11::string::~string((string *)local_268);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)local_170);
  std::__cxx11::string::~string((string *)local_50);
  return;
}

Assistant:

void Generator::PrintMessage(const Descriptor& message_descriptor,
                             const std::string& prefix,
                             std::vector<std::string>* to_register,
                             bool is_nested) const {
  std::string qualified_name;
  if (is_nested) {
    if (IsPythonKeyword(message_descriptor.name())) {
      qualified_name =
          "getattr(" + prefix + ", '" + message_descriptor.name() + "')";
    } else {
      qualified_name = prefix + "." + message_descriptor.name();
    }
    printer_->Print(
        "'$name$' : _reflection.GeneratedProtocolMessageType('$name$', "
        "(_message.Message,), {\n",
        "name", message_descriptor.name());
  } else {
    qualified_name = ResolveKeyword(message_descriptor.name());
    printer_->Print(
        "$qualified_name$ = _reflection.GeneratedProtocolMessageType('$name$', "
        "(_message.Message,), {\n",
        "qualified_name", qualified_name, "name", message_descriptor.name());
  }
  printer_->Indent();

  to_register->push_back(qualified_name);

  PrintNestedMessages(message_descriptor, qualified_name, to_register);
  std::map<std::string, std::string> m;
  m["descriptor_key"] = kDescriptorKey;
  if (pure_python_workable_) {
    m["descriptor_name"] = ModuleLevelDescriptorName(message_descriptor);
  } else {
    m["descriptor_name"] = "_descriptor.Descriptor(full_name='" +
                           message_descriptor.full_name() + "')";
  }
  printer_->Print(m, "'$descriptor_key$' : $descriptor_name$,\n");
  std::string module_name = ModuleName(file_->name());
  printer_->Print("'__module__' : '$module_name$'\n", "module_name",
                  module_name);
  printer_->Print("# @@protoc_insertion_point(class_scope:$full_name$)\n",
                  "full_name", message_descriptor.full_name());
  printer_->Print("})\n");
  printer_->Outdent();
}